

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gif_in.c
# Opt level: O2

int LWZReadByte(gdIOCtx *fd,LZW_STATIC_DATA *sd,char flag,int input_code_size,int *ZeroDataBlockP)

{
  int *piVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  int *piVar10;
  uchar buf [260];
  
  if (flag == '\0') {
    if (sd->fresh == 0) {
      piVar10 = sd->sp;
      piVar1 = sd->stack;
      if (piVar1 < piVar10) {
        sd->sp = piVar10 + -1;
        iVar4 = piVar10[-1];
      }
      else {
        do {
          uVar3 = GetCode(fd,&sd->scd,sd->code_size,0,ZeroDataBlockP);
          if ((int)uVar3 < 0) {
            return uVar3;
          }
          if (uVar3 == sd->clear_code) {
            uVar7 = (ulong)uVar3;
            for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
              sd->table[0][uVar5] = 0;
              sd->table[1][uVar5] = (int)uVar5;
            }
            for (; uVar7 < 0x1000; uVar7 = uVar7 + 1) {
              sd->table[1][uVar7] = 0;
              sd->table[0][uVar7] = 0;
            }
            iVar4 = sd->set_code_size + 1;
            sd->code_size = iVar4;
            sd->max_code_size = uVar3 * 2;
            sd->max_code = uVar3 + 2;
            sd->sp = piVar1;
            iVar4 = GetCode(fd,&sd->scd,iVar4,0,ZeroDataBlockP);
            sd->oldcode = iVar4;
            sd->firstcode = iVar4;
            return iVar4;
          }
          if (uVar3 == sd->end_code) {
            if (*ZeroDataBlockP != 0) {
              return -2;
            }
            do {
              iVar4 = GetDataBlock(fd,buf,ZeroDataBlockP);
            } while (0 < iVar4);
            if (iVar4 != 0) {
              return -2;
            }
          }
          piVar10 = sd->sp;
          if (piVar10 == (int *)&sd->field_0x10024) {
            return -1;
          }
          uVar6 = uVar3;
          if (sd->max_code <= (int)uVar3) {
            sd->sp = piVar10 + 1;
            *piVar10 = sd->firstcode;
            piVar10 = piVar10 + 1;
            uVar6 = sd->oldcode;
          }
          for (; sd->clear_code <= (int)uVar6; uVar6 = sd->table[0][(int)uVar6]) {
            if (piVar10 == (int *)&sd->field_0x10024) {
              return -1;
            }
            if (0xfff < (int)uVar6) {
              return -1;
            }
            iVar4 = sd->table[1][(int)uVar6];
            sd->sp = piVar10 + 1;
            *piVar10 = iVar4;
            piVar10 = piVar10 + 1;
          }
          if (0xfff < (int)uVar6) {
            return -1;
          }
          iVar4 = sd->table[1][(int)uVar6];
          sd->firstcode = iVar4;
          sd->sp = piVar10 + 1;
          *piVar10 = iVar4;
          lVar8 = (long)sd->max_code;
          if (lVar8 < 0x1000) {
            sd->table[0][lVar8] = sd->oldcode;
            sd->table[1][lVar8] = sd->firstcode;
            iVar4 = sd->max_code_size;
            iVar9 = sd->max_code + 1;
            sd->max_code = iVar9;
            if (iVar4 < 0x1000 && iVar4 <= iVar9) {
              sd->max_code_size = iVar4 * 2;
              sd->code_size = sd->code_size + 1;
            }
          }
          sd->oldcode = uVar3;
        } while (piVar10 + 1 <= piVar1);
        sd->sp = piVar10;
        iVar4 = *piVar10;
      }
    }
    else {
      sd->fresh = 0;
      do {
        iVar4 = GetCode(fd,&sd->scd,sd->code_size,0,ZeroDataBlockP);
        sd->oldcode = iVar4;
        sd->firstcode = iVar4;
      } while (iVar4 == sd->clear_code);
    }
  }
  else {
    sd->set_code_size = input_code_size;
    bVar2 = (byte)input_code_size & 0x1f;
    uVar3 = 1 << bVar2;
    sd->code_size = input_code_size + 1;
    sd->clear_code = uVar3;
    sd->end_code = uVar3 + 1;
    sd->max_code_size = 2 << ((byte)input_code_size & 0x1f);
    sd->max_code = uVar3 + 2;
    (sd->scd).curbit = 0;
    (sd->scd).lastbit = 0;
    (sd->scd).done = 0;
    (sd->scd).last_byte = 2;
    sd->fresh = 1;
    uVar7 = 0;
    uVar5 = (ulong)uVar3;
    if (1 << bVar2 < 1) {
      uVar5 = uVar7;
    }
    for (; uVar5 != uVar7; uVar7 = uVar7 + 1) {
      sd->table[0][uVar7] = 0;
      sd->table[1][uVar7] = (int)uVar7;
    }
    for (; uVar5 < 0x1000; uVar5 = uVar5 + 1) {
      sd->table[1][0] = 0;
      sd->table[0][uVar5] = 0;
    }
    sd->sp = sd->stack;
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static int
LWZReadByte(gdIOCtx *fd, LZW_STATIC_DATA *sd, char flag, int input_code_size, int *ZeroDataBlockP)
{
	int rv;

	rv = LWZReadByte_(fd, sd, flag, input_code_size, ZeroDataBlockP);

	if(VERBOSE) {
		printf("[LWZReadByte(,%d,%d) returning %d]\n",flag,input_code_size,rv);
	}

	return rv;
}